

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O1

void __thiscall pstore::basic_logger::basic_logger(basic_logger *this)

{
  (this->super_logger).buffer_._M_dataplus._M_p = (pointer)&(this->super_logger).buffer_.field_2;
  (this->super_logger).buffer_._M_string_length = 0;
  (this->super_logger).buffer_.field_2._M_local_buf[0] = '\0';
  (this->super_logger).priority_ = debug;
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__basic_logger_0027a6f8;
  get_current_thread_name_abi_cxx11_();
  return;
}

Assistant:

basic_logger () = default;